

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode7Operand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  cs_struct *h;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  MCOperand *MO1;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  MCInst *in_stack_ffffffffffffffd0;
  MCInst *MI_00;
  
  h = (cs_struct *)MCInst_getOperand(in_RDI,in_ESI);
  SStream_concat0((SStream *)in_stack_ffffffffffffffd0,
                  (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  set_mem_access(in_stack_ffffffffffffffd0,(_Bool)in_stack_ffffffffffffffcf);
  MI_00 = (MCInst *)in_RDI->csh;
  MCOperand_getReg((MCOperand *)h);
  printRegName(h,in_RDX,(uint)((ulong)MI_00 >> 0x20));
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    uVar1 = MCOperand_getReg((MCOperand *)h);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar1;
  }
  SStream_concat0((SStream *)MI_00,
                  (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  set_mem_access(MI_00,(_Bool)in_stack_ffffffffffffffcf);
  return;
}

Assistant:

static void printAddrMode7Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}